

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::CreateCustomTargetsAndCommands
          (cmLocalGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lang)

{
  cmTarget *this_00;
  bool bVar1;
  uint uVar2;
  cmGeneratorTargetsType *pcVar3;
  pointer ppVar4;
  ulong uVar5;
  char *m2;
  size_type sVar6;
  allocator local_b1;
  string local_b0;
  undefined1 local_90 [8];
  string llang;
  cmGeneratorTarget *target;
  _Self local_58;
  _Self local_50;
  iterator l;
  cmGeneratorTargetsType tgts;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lang_local;
  cmLocalGenerator *this_local;
  
  pcVar3 = cmMakefile::GetGeneratorTargets(this->Makefile);
  std::
  map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::map((map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
         *)&l,pcVar3);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
       ::begin((map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
                *)&l);
  while( true ) {
    local_58._M_node =
         (_Base_ptr)
         std::
         map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
         ::end((map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
                *)&l);
    bVar1 = std::operator!=(&local_50,&local_58);
    if (!bVar1) break;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>::
             operator->(&local_50);
    bVar1 = cmTarget::IsImported(ppVar4->first);
    if (!bVar1) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>::
               operator->(&local_50);
      llang.field_2._8_8_ = ppVar4->second;
      uVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)llang.field_2._8_8_);
      if (uVar2 < 4) {
        this_00 = *(cmTarget **)llang.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b0,"",&local_b1);
        cmTarget::GetLinkerLanguage((string *)local_90,this_00,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          sVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(lang,(key_type *)local_90);
          if (sVar6 == 0) {
            AddBuildTargetRule(this,(string *)local_90,(cmGeneratorTarget *)llang.field_2._8_8_);
          }
          bVar1 = false;
        }
        else {
          cmTarget::GetName_abi_cxx11_(*(cmTarget **)llang.field_2._8_8_);
          m2 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error
                    ("CMake can not determine linker language for target: ",m2,(char *)0x0,
                     (char *)0x0);
          bVar1 = true;
        }
        std::__cxx11::string::~string((string *)local_90);
        if (bVar1) break;
      }
    }
    std::_Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>::operator++
              (&local_50,0);
  }
  std::
  map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::~map((map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
          *)&l);
  return;
}

Assistant:

void cmLocalGenerator
::CreateCustomTargetsAndCommands(std::set<std::string> const& lang)
{
  cmGeneratorTargetsType tgts = this->Makefile->GetGeneratorTargets();
  for(cmGeneratorTargetsType::iterator l = tgts.begin();
      l != tgts.end(); l++)
    {
    if (l->first->IsImported())
      {
      continue;
      }
    cmGeneratorTarget& target = *l->second;
    switch(target.GetType())
      {
      case cmTarget::STATIC_LIBRARY:
      case cmTarget::SHARED_LIBRARY:
      case cmTarget::MODULE_LIBRARY:
      case cmTarget::EXECUTABLE:
        {
        std::string llang = target.Target->GetLinkerLanguage();
        if(llang.empty())
          {
          cmSystemTools::Error
            ("CMake can not determine linker language for target: ",
             target.Target->GetName().c_str());
          return;
          }
        // if the language is not in the set lang then create custom
        // commands to build the target
        if(lang.count(llang) == 0)
          {
          this->AddBuildTargetRule(llang, target);
          }
        }
        break;
      default:
        break;
      }
    }
}